

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

QcSocket * qc_tcp_accept(QcSocket *socket)

{
  int iVar1;
  socklen_t local_34;
  undefined1 local_30 [4];
  int addr_len;
  sockaddr addr;
  QcSocket *new_sock;
  QcSocket *socket_local;
  
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xa9);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xa9,"QcSocket *qc_tcp_accept(QcSocket *)");
  }
  addr.sa_data._6_8_ = malloc(4);
  if ((void *)addr.sa_data._6_8_ == (void *)0x0) {
    fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xab);
    if (addr.sa_data._6_8_ == 0) {
      __assert_fail("new_sock",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                    ,0xab,"QcSocket *qc_tcp_accept(QcSocket *)");
    }
  }
  else {
    memset((void *)addr.sa_data._6_8_,0,4);
  }
  local_34 = 0x10;
  iVar1 = accept(socket->sockfd,(sockaddr *)local_30,&local_34);
  *(int *)addr.sa_data._6_8_ = iVar1;
  if (*(int *)addr.sa_data._6_8_ < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0xb2,"socket accept failed");
    free((void *)addr.sa_data._6_8_);
    socket_local = (QcSocket *)0x0;
  }
  else {
    socket_local = (QcSocket *)addr.sa_data._6_8_;
  }
  return socket_local;
}

Assistant:

QcSocket* qc_tcp_accept(QcSocket *socket)
{
    QcSocket *new_sock;
    struct sockaddr addr;
    int addr_len;

    qc_assert(socket);

    qc_malloc(new_sock, sizeof(QcSocket));

    addr_len = sizeof(addr);

    new_sock->sockfd = (int)accept(socket->sockfd, &addr, (socklen_t*)&addr_len);
    if(new_sock->sockfd < 0)
    {
        qc_error("socket accept failed");
        qc_free(new_sock);
        return NULL;
    }

    return new_sock;
}